

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

vec3 vec3_rotate_y(vec3 v,float theta)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  vec3 vVar6;
  undefined4 local_18;
  undefined4 uStack_14;
  
  fVar3 = v.z;
  fVar1 = cosf(theta);
  fVar2 = sinf(theta);
  local_18 = v.x;
  uStack_14 = v.y;
  fVar5 = fVar3 * 0.0 + local_18 * 0.0 + uStack_14;
  fVar4 = fVar5 * 0.0 * (1.0 - fVar1);
  vVar6.z = (uStack_14 * 0.0 - local_18) * fVar2 + fVar1 * fVar3 + fVar4;
  vVar6.y = (fVar3 * -0.0 + local_18 * 0.0) * fVar2 + (1.0 - fVar1) * fVar5 + uStack_14 * fVar1;
  vVar6.x = (uStack_14 * -0.0 + fVar3) * fVar2 + local_18 * fVar1 + fVar4;
  return vVar6;
}

Assistant:

vec3 vec3_rotate_y(vec3 v, float theta) {
    return vec3_rotate_about_axis(v, V3(0.0f, 1.0f, 0.0f), theta);
}